

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Error CheckArgumentValue(char *arg)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  long lVar3;
  long *plVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  char *in_RSI;
  element_type *in_RDI;
  Error EVar6;
  undefined1 auVar7 [12];
  allocator local_59;
  char *local_58;
  char *local_50 [2];
  char local_40 [16];
  char *local_30;
  
  std::__cxx11::string::string((string *)local_50,in_RSI,&local_59);
  __nptr = local_50[0];
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol(__nptr,&local_30,10);
  if (local_30 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar3 == lVar3) && (*piVar2 != 0x22)) {
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    _Var5._M_pi = extraout_RDX;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
      _Var5._M_pi = extraout_RDX_00;
    }
    in_RDI->_vptr_IError = (_func_int **)0x0;
    (in_RDI->super_enable_shared_from_this<gerr::details::IError>)._M_weak_this.
    super___weak_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    goto LAB_001035cd;
  }
  auVar7 = std::__throw_out_of_range("stoi");
  if (auVar7._8_4_ != 1) {
    _Unwind_Resume(auVar7._0_8_);
  }
  plVar4 = (long *)__cxa_begin_catch(auVar7._0_8_);
  local_50[0] = (char *)(**(code **)(*plVar4 + 0x10))(plVar4);
  gerr::New<char_const*&,char_const*>((gerr *)in_RDI,"conv exception:{}",&local_58,local_50);
  __cxa_end_catch();
  _Var5._M_pi = extraout_RDX_01;
LAB_001035cd:
  EVar6.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  EVar6.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Error)EVar6.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

gerr::Error CheckArgumentValue(char const* arg) {
  try {
    std::stoi(arg);
  } catch (std::exception const& e) {
    return gerr::New("conv exception:{}", arg, e.what());
  }
  return nullptr;
}